

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

_Bool fs_stdio_make_directory(char *tail)

{
  _Bool _Var1;
  WRAP_CHAR *__s;
  size_t sVar2;
  char *pcVar3;
  
  __s = make_absolute_path(tail);
  if (__s == (WRAP_CHAR *)0x0) {
    _Var1 = false;
  }
  else {
    sVar2 = strlen(__s);
    if (1 < (long)sVar2) {
      pcVar3 = __s + 1;
      do {
        if (*pcVar3 == '/') {
          *pcVar3 = '\0';
          _Var1 = mkdir_exists(__s);
          *pcVar3 = '/';
          if (!_Var1) {
            _Var1 = false;
            goto LAB_0015b1b3;
          }
        }
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 < __s + sVar2);
    }
    _Var1 = mkdir_exists(__s);
LAB_0015b1b3:
    free(__s);
  }
  return _Var1;
}

Assistant:

static bool fs_stdio_make_directory(const char *tail)
{
   bool ret = false;
   WRAP_CHAR *abs_path = make_absolute_path(tail);
   if (abs_path) {
      ret = do_make_directory(abs_path);
      free(abs_path);
   }
   return ret;
}